

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_backtrace_plugin_test.cpp
# Opt level: O1

void badass_function(void)

{
  DAT_0000002a = 0x2a;
  return;
}

Assistant:

void badass_function(void)
{
#if defined(__clang__)
	#pragma clang diagnostic push
	#pragma clang diagnostic ignored "-Warray-bounds"
#elif defined(__GNUC__)
	#pragma GCC diagnostic push
	#pragma GCC diagnostic ignored "-Warray-bounds"
	#pragma GCC diagnostic ignored "-Wstringop-overflow="
#endif

	char *ptr = (char *)42;
	*ptr = 42;

#if defined(__clang__)
	#pragma clang diagnostic pop
#elif defined(__GNUC__)
	#pragma GCC diagnostic pop
#endif
}